

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void init_config(AV1_COMP *cpi,AV1EncoderConfig *oxcf)

{
  AV1_COMP *cpi_00;
  long *in_RSI;
  long *in_RDI;
  ResizePendingParams *resize_pending_params;
  AV1_COMMON *cm;
  _Bool in_stack_00000077;
  AV1EncoderConfig *in_stack_00000078;
  AV1_COMP *in_stack_00000080;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  cpi_00 = (AV1_COMP *)((long)in_RDI + 0x7130c);
  memcpy(in_RDI + 0x8464,in_RSI,0x480);
  in_RDI[0xc116] = *in_RSI;
  *(int *)(in_RDI + 0x77f7) = (int)in_RSI[3];
  *(undefined4 *)((long)in_RDI + 0x3bfbc) = *(undefined4 *)((long)in_RSI + 0x1c);
  *(undefined1 *)(in_RDI + 0x13ac2) = 0;
  alloc_compressor_data(cpi_00);
  *(int *)((long)in_RDI + 0x712f4) = (int)in_RDI[0x77f7];
  *(undefined4 *)(in_RDI + 0xe25f) = *(undefined4 *)((long)in_RDI + 0x3bfbc);
  *(undefined1 *)(in_RDI + 0xe260) = 0;
  in_RDI[0x7591] = (long)(in_RDI + 0x77d2);
  *(undefined4 *)(in_RDI + 0x13a67) = 1;
  *(undefined4 *)((long)in_RDI + 0x9d33c) = 1;
  *(undefined4 *)(in_RDI + 0x8462) = 0;
  *(undefined4 *)((long)in_RDI + 0x4230c) = 0;
  *(undefined4 *)(*in_RDI + 0x14dc0) = 0;
  *(undefined4 *)(*in_RDI + 0x14dc4) = 0;
  *(undefined4 *)(*in_RDI + 0x14dc8) = 0;
  *(undefined4 *)(*in_RDI + 0x14dcc) = 0;
  *(undefined4 *)(*in_RDI + 0x14dd0) = 0;
  av1_change_config(in_stack_00000080,in_stack_00000078,in_stack_00000077);
  *(undefined4 *)(in_RDI + 0xc117) = 0;
  *(undefined4 *)&cpi_00->ppi = 0;
  *(undefined4 *)((long)&cpi_00->ppi + 4) = 0;
  av1_setup_scale_factors_for_frame
            ((scale_factors *)cpi_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0,0x22c78c)
  ;
  init_buffer_indices((ForceIntegerMVInfo *)(in_RDI + 0x8586),(int *)(in_RDI + 0x780e));
  av1_noise_estimate_init
            ((NOISE_ESTIMATE *)(in_RDI + 0x13a9c),(int)in_RDI[0x77f7],
             *(int *)((long)in_RDI + 0x3bfbc));
  return;
}

Assistant:

static void init_config(struct AV1_COMP *cpi, const AV1EncoderConfig *oxcf) {
  AV1_COMMON *const cm = &cpi->common;
  ResizePendingParams *resize_pending_params = &cpi->resize_pending_params;

  cpi->oxcf = *oxcf;
  cpi->framerate = oxcf->input_cfg.init_framerate;

  cm->width = oxcf->frm_dim_cfg.width;
  cm->height = oxcf->frm_dim_cfg.height;
  cpi->is_dropped_frame = false;

  alloc_compressor_data(cpi);

  cpi->data_alloc_width = cm->width;
  cpi->data_alloc_height = cm->height;
  cpi->frame_size_related_setup_done = false;

  // Single thread case: use counts in common.
  cpi->td.counts = &cpi->counts;

  // Init SVC parameters.
  cpi->svc.number_spatial_layers = 1;
  cpi->svc.number_temporal_layers = 1;
  cm->spatial_layer_id = 0;
  cm->temporal_layer_id = 0;
  // Init rtc_ref parameters.
  cpi->ppi->rtc_ref.set_ref_frame_config = 0;
  cpi->ppi->rtc_ref.non_reference_frame = 0;
  cpi->ppi->rtc_ref.ref_frame_comp[0] = 0;
  cpi->ppi->rtc_ref.ref_frame_comp[1] = 0;
  cpi->ppi->rtc_ref.ref_frame_comp[2] = 0;

  // change includes all joint functionality
  av1_change_config(cpi, oxcf, false);

  cpi->ref_frame_flags = 0;

  // Reset resize pending flags
  resize_pending_params->width = 0;
  resize_pending_params->height = 0;

  // Setup identity scale factor
  av1_setup_scale_factors_for_frame(&cm->sf_identity, 1, 1, 1, 1);

  init_buffer_indices(&cpi->force_intpel_info, cm->remapped_ref_idx);

  av1_noise_estimate_init(&cpi->noise_estimate, cm->width, cm->height);
}